

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<std::complex<long_double>_>::PrepareZ
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *y,
          TPZFMatrix<std::complex<long_double>_> *z,complex<long_double> beta,int opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  complex<long_double> *pcVar4;
  long lVar5;
  complex<long_double> *__dest;
  long lVar6;
  long lVar7;
  long lVar8;
  longdouble lVar9;
  
  lVar1 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar2 = (y->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xd])(z,lVar1,lVar2);
  if (0 < lVar2) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      lVar9 = (longdouble)0;
      lVar7 = (z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
      if ((lVar7 < 1) ||
         ((z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <= lVar6)) {
        TPZFMatrix<std::complex<long_double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      __dest = z->fElem + lVar7 * lVar6;
      if ((((longdouble)beta._M_value._0_10_ != lVar9) ||
          ((longdouble)beta._M_value._16_10_ != lVar9)) ||
         (NAN((longdouble)beta._M_value._16_10_) || NAN(lVar9))) {
        if (z != y) {
          memcpy(__dest,y->fElem +
                        (y->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow *
                        lVar6,lVar1 * 0x20);
        }
        if (0 < lVar1) {
          lVar8 = 0;
          lVar7 = 0;
          do {
            lVar3 = (z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
            if ((lVar3 <= lVar7) ||
               ((z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <= lVar6))
            {
              TPZFMatrix<std::complex<long_double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            std::complex<long_double>::operator*=
                      ((complex<long_double> *)(z->fElem->_M_value + lVar8 + lVar3 * lVar5),&beta);
            lVar7 = lVar7 + 1;
            lVar8 = lVar8 + 0x20;
          } while (lVar1 != lVar7);
        }
      }
      else if (lVar1 != 0) {
        pcVar4 = __dest + lVar1;
        do {
          *(longdouble *)__dest->_M_value = lVar9;
          *(longdouble *)(__dest->_M_value + 0x10) = lVar9;
          __dest = __dest + 1;
        } while (__dest != pcVar4);
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x20;
    } while (lVar6 != lVar2);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}